

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::UninterpretedOption::MergeFrom
          (UninterpretedOption *this,UninterpretedOption *from)

{
  uint uVar1;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  long in_RSI;
  UninterpretedOption *in_RDI;
  uint32 cached_has_bits;
  UnknownFieldSet *in_stack_ffffffffffffff08;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff28;
  
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)(in_RSI + 8);
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    if (((uint)*(undefined8 *)this_00 & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                (this_00);
      in_stack_ffffffffffffff10 = this_00;
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
      in_stack_ffffffffffffff10 = this_00;
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::MergeFrom
            ((RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *)
             in_stack_ffffffffffffff10,
             (RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *)
             in_stack_ffffffffffffff08);
  uVar1 = *(uint *)(in_RSI + 0x10);
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_identifier_value_abi_cxx11_((UninterpretedOption *)0x69b829);
      _internal_set_identifier_value(in_RDI,in_stack_ffffffffffffff28);
    }
    if ((uVar1 & 2) != 0) {
      _internal_string_value_abi_cxx11_((UninterpretedOption *)0x69b84f);
      _internal_set_string_value(in_RDI,in_stack_ffffffffffffff28);
    }
    if ((uVar1 & 4) != 0) {
      _internal_aggregate_value_abi_cxx11_((UninterpretedOption *)0x69b875);
      _internal_set_aggregate_value(in_RDI,in_stack_ffffffffffffff28);
    }
    if ((uVar1 & 8) != 0) {
      in_RDI->positive_int_value_ = *(uint64 *)(in_RSI + 0x48);
    }
    if ((uVar1 & 0x10) != 0) {
      in_RDI->negative_int_value_ = *(int64 *)(in_RSI + 0x50);
    }
    if ((uVar1 & 0x20) != 0) {
      in_RDI->double_value_ = *(double *)(in_RSI + 0x58);
    }
    (in_RDI->_has_bits_).has_bits_[0] = uVar1 | (in_RDI->_has_bits_).has_bits_[0];
  }
  return;
}

Assistant:

void UninterpretedOption::MergeFrom(const UninterpretedOption& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.UninterpretedOption)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  name_.MergeFrom(from.name_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x0000003fu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_identifier_value(from._internal_identifier_value());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_string_value(from._internal_string_value());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_set_aggregate_value(from._internal_aggregate_value());
    }
    if (cached_has_bits & 0x00000008u) {
      positive_int_value_ = from.positive_int_value_;
    }
    if (cached_has_bits & 0x00000010u) {
      negative_int_value_ = from.negative_int_value_;
    }
    if (cached_has_bits & 0x00000020u) {
      double_value_ = from.double_value_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}